

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O2

int Abc_NtkRetimeFinalizeLatches
              (Abc_Ntk_t *pNtk,st__table *tLatches,int nIdMaxStart,int fUseOldNames)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  char *pSuffix;
  int iVar8;
  Vec_Ptr_t *p_00;
  int Index;
  Vec_Ptr_t *local_70;
  Vec_Ptr_t *local_68;
  Vec_Ptr_t *local_60;
  int local_58;
  uint local_54;
  Vec_Ptr_t *local_50;
  Abc_Obj_t *local_48;
  Vec_Ptr_t *local_40;
  Abc_Ntk_t *local_38;
  
  p_00 = pNtk->vCis;
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  local_58 = fUseOldNames;
  local_54 = nIdMaxStart;
  local_60 = Vec_PtrAlloc(100);
  p = pNtk->vCos;
  pNtk->vCos = (Vec_Ptr_t *)0x0;
  local_68 = Vec_PtrAlloc(100);
  pVVar1 = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  local_70 = Vec_PtrAlloc(100);
  for (iVar8 = 0; iVar2 = tLatches->num_entries, iVar8 < p_00->nSize - iVar2; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(p_00,iVar8);
    Vec_PtrPush(local_60,pvVar3);
  }
  for (iVar8 = 0; iVar8 < p->nSize - iVar2; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(p,iVar8);
    Vec_PtrPush(local_68,pvVar3);
    iVar2 = tLatches->num_entries;
  }
  for (iVar8 = 0; iVar8 < pVVar1->nSize - iVar2; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(pVVar1,iVar8);
    Vec_PtrPush(local_70,pvVar3);
    iVar2 = tLatches->num_entries;
  }
  iVar8 = 0;
  local_50 = pVVar1;
  local_40 = p_00;
  local_38 = pNtk;
  do {
    pVVar1 = local_50;
    if (pNtk->vObjs->nSize <= iVar8) {
      for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar8);
        if ((((*(uint *)&pAVar4->field_0x14 & 0xf) != 2) && ((pAVar4->vFanins).nSize == 0)) &&
           ((pAVar4->vFanouts).nSize == 0)) {
          Abc_NtkDeleteObj(pAVar4);
        }
      }
      for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar8);
        if ((((*(uint *)&pAVar4->field_0x14 & 0xf) != 3) && ((pAVar4->vFanins).nSize == 0)) &&
           ((pAVar4->vFanouts).nSize == 0)) {
          Abc_NtkDeleteObj(pAVar4);
        }
      }
      pNtk->vCis = local_60;
      Vec_PtrFree(p_00);
      pNtk->vCos = local_68;
      Vec_PtrFree(p);
      pNtk->vBoxes = local_70;
      Vec_PtrFree(pVVar1);
      return 1;
    }
    pAVar4 = Abc_NtkObj(pNtk,iVar8);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8)) {
      if ((uint)pAVar4->Id < local_54) {
        iVar2 = st__lookup_int(tLatches,(char *)pAVar4,&Index);
        if (iVar2 == 0) {
          puts("Abc_NtkRetimeFinalizeLatches(): Internal error.");
          return 0;
        }
        pAVar5 = (Abc_Obj_t *)
                 Vec_PtrEntry(local_50,(local_50->nSize - tLatches->num_entries) + Index);
        if (pAVar4 != pAVar5) {
          __assert_fail("pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retIncrem.c"
                        ,0xc1,"int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *, st__table *, int, int)"
                       );
        }
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p,(p->nSize - tLatches->num_entries) + Index);
        local_48 = (Abc_Obj_t *)Vec_PtrEntry(p_00,(p_00->nSize - tLatches->num_entries) + Index);
      }
      else {
        pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
        pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
        local_48 = pAVar6;
        if (local_58 == 0) {
          pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
          Abc_ObjAssignName(pAVar6,pcVar7,"_o2");
          pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
          pSuffix = "_i2";
        }
        else {
          pcVar7 = Abc_ObjName(pAVar4);
          Abc_ObjAssignName(pAVar6,pcVar7,"_out");
          pcVar7 = Abc_ObjName(pAVar4);
          pSuffix = "_in";
        }
        Abc_ObjAssignName(pAVar5,pcVar7,pSuffix);
      }
      Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
      Abc_ObjPatchFanin(pAVar4,(Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray],
                        pAVar5);
      pAVar6 = local_48;
      if (0 < (pAVar4->vFanouts).nSize) {
        Abc_ObjTransferFanout(pAVar4,local_48);
      }
      Abc_ObjAddFanin(pAVar6,pAVar4);
      Vec_PtrPush(local_60,pAVar6);
      Vec_PtrPush(local_68,pAVar5);
      Vec_PtrPush(local_70,pAVar4);
      pNtk = local_38;
      p_00 = local_40;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Abc_NtkRetimeFinalizeLatches( Abc_Ntk_t * pNtk, st__table * tLatches, int nIdMaxStart, int fUseOldNames )
{
    Vec_Ptr_t * vCisOld, * vCosOld, * vBoxesOld, * vCisNew, * vCosNew, * vBoxesNew;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut;
    int i, Index;
    // create new arrays
    vCisOld   = pNtk->vCis;    pNtk->vCis   = NULL;  vCisNew   = Vec_PtrAlloc( 100 );
    vCosOld   = pNtk->vCos;    pNtk->vCos   = NULL;  vCosNew   = Vec_PtrAlloc( 100 );  
    vBoxesOld = pNtk->vBoxes;  pNtk->vBoxes = NULL;  vBoxesNew = Vec_PtrAlloc( 100 );
    // copy boxes and their CIs/COs
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCisOld, pObj, i, Vec_PtrSize(vCisOld) - st__count(tLatches) )
        Vec_PtrPush( vCisNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCosOld, pObj, i, Vec_PtrSize(vCosOld) - st__count(tLatches) )
        Vec_PtrPush( vCosNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vBoxesOld, pObj, i, Vec_PtrSize(vBoxesOld) - st__count(tLatches) )
        Vec_PtrPush( vBoxesNew, pObj );
    // go through the latches
    Abc_NtkForEachObj( pNtk, pLatch, i )
    {
        if ( !Abc_ObjIsLatch(pLatch) )
            continue;
        if ( Abc_ObjId(pLatch) >= (unsigned)nIdMaxStart )
        {
            // this is a new latch 
            pLatchIn  = Abc_NtkCreateBi(pNtk);
            pLatchOut = Abc_NtkCreateBo(pNtk);

            if ( fUseOldNames )
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
            }
            else
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(Abc_ObjFanin0(pLatch)), "_o2" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(Abc_ObjFanin0(pLatch)), "_i2" );
            }
        }
        else
        {
            // this is an old latch 
            // get its number in the original order
            if ( ! st__lookup_int( tLatches, (char *)pLatch, &Index ) )
            {
                printf( "Abc_NtkRetimeFinalizeLatches(): Internal error.\n" );
                return 0;
            }
            assert( pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index) );
            // reconnect with the old LIs/LOs
            pLatchIn  = (Abc_Obj_t *)Vec_PtrEntry( vCosOld, Vec_PtrSize(vCosOld) - st__count(tLatches) + Index );
            pLatchOut = (Abc_Obj_t *)Vec_PtrEntry( vCisOld, Vec_PtrSize(vCisOld) - st__count(tLatches) + Index );
        }
        // connect
        Abc_ObjAddFanin( pLatchIn, Abc_ObjFanin0(pLatch) );
        Abc_ObjPatchFanin( pLatch, Abc_ObjFanin0(pLatch), pLatchIn );
        if ( Abc_ObjFanoutNum(pLatch) > 0 )
            Abc_ObjTransferFanout( pLatch, pLatchOut );
        Abc_ObjAddFanin( pLatchOut, pLatch );
        // add to the arrays
        Vec_PtrPush( vCisNew, pLatchOut );
        Vec_PtrPush( vCosNew, pLatchIn );
        Vec_PtrPush( vBoxesNew, pLatch );
    }
    // free useless Cis/Cos
    Vec_PtrForEachEntry( Abc_Obj_t *, vCisOld, pObj, i )
        if ( !Abc_ObjIsPi(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    Vec_PtrForEachEntry( Abc_Obj_t *, vCosOld, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    // set the new arrays
    pNtk->vCis   = vCisNew;   Vec_PtrFree( vCisOld );
    pNtk->vCos   = vCosNew;   Vec_PtrFree( vCosOld );
    pNtk->vBoxes = vBoxesNew; Vec_PtrFree( vBoxesOld );
    return 1;
}